

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_test.cc
# Opt level: O0

void __thiscall anon_unknown.dwarf_1933e1::ConvolveTestBase::SetUp(ConvolveTestBase *this)

{
  bool bVar1;
  uint8_t uVar2;
  uint16_t uVar3;
  __tuple_element_t<2UL,_tuple<int,_int,_const_ConvolveFunctions_*>_> *ppCVar4;
  ACMRandom *in_RDI;
  ConvolveTestBase *unaff_retaddr;
  int i_1;
  ACMRandom prng;
  int i;
  uint local_14;
  int local_c;
  ACMRandom *pAVar5;
  
  pAVar5 = in_RDI;
  testing::
  WithParamInterface<std::tuple<int,_int,_const_(anonymous_namespace)::ConvolveFunctions_*>_>::
  GetParam();
  ppCVar4 = std::get<2ul,int,int,(anonymous_namespace)::ConvolveFunctions_const*>
                      ((tuple<int,_int,_const_(anonymous_namespace)::ConvolveFunctions_*> *)0x445c70
                      );
  *(__tuple_element_t<2UL,_tuple<int,_int,_const_ConvolveFunctions_*>_> *)(in_RDI + 6) = *ppCVar4;
  if (*(int *)(*(long *)(in_RDI + 6) + 0x10) == 0) {
    in_RDI[8].random_.state_ = 0xff;
  }
  else {
    in_RDI[8].random_.state_ =
         (1 << ((byte)*(undefined4 *)(*(long *)(in_RDI + 6) + 0x10) & 0x1f)) - 1;
  }
  for (local_c = 0; local_c < 0x40000; local_c = local_c + 1) {
    bVar1 = IsIndexInBorder(unaff_retaddr,(int)((ulong)pAVar5 >> 0x20));
    if (bVar1) {
      *(undefined1 *)((anonymous_namespace)::ConvolveTestBase::output_ + local_c) = 0xff;
      *(short *)((anonymous_namespace)::ConvolveTestBase::output16_ + (long)local_c * 2) =
           (short)in_RDI[8].random_.state_;
    }
    else {
      *(undefined1 *)((anonymous_namespace)::ConvolveTestBase::output_ + local_c) = 0;
      *(undefined2 *)((anonymous_namespace)::ConvolveTestBase::output16_ + (long)local_c * 2) = 0;
    }
  }
  libaom_test::ACMRandom::ACMRandom(in_RDI);
  for (local_14 = 0; (int)local_14 < 0x40000; local_14 = local_14 + 1) {
    if ((local_14 & 1) == 0) {
      uVar2 = libaom_test::ACMRandom::Rand8Extremes(in_RDI);
      *(uint8_t *)((anonymous_namespace)::ConvolveTestBase::input_ + (int)local_14) = uVar2;
      uVar3 = libaom_test::ACMRandom::Rand16(in_RDI);
      *(uint16_t *)((anonymous_namespace)::ConvolveTestBase::input16_ + (long)(int)local_14 * 2) =
           uVar3 & (ushort)in_RDI[8].random_.state_;
    }
    else {
      *(undefined1 *)((anonymous_namespace)::ConvolveTestBase::input_ + (int)local_14) = 0xff;
      *(short *)((anonymous_namespace)::ConvolveTestBase::input16_ + (long)(int)local_14 * 2) =
           (short)in_RDI[8].random_.state_;
    }
  }
  return;
}

Assistant:

void SetUp() override {
    UUT_ = GET_PARAM(2);
    if (UUT_->use_highbd_ != 0)
      mask_ = (1 << UUT_->use_highbd_) - 1;
    else
      mask_ = 255;
    /* Set up guard blocks for an inner block centered in the outer block */
    for (int i = 0; i < kOutputBufferSize; ++i) {
      if (IsIndexInBorder(i)) {
        output_[i] = 255;
        output16_[i] = mask_;
      } else {
        output_[i] = 0;
        output16_[i] = 0;
      }
    }

    ::libaom_test::ACMRandom prng;
    for (int i = 0; i < kInputBufferSize; ++i) {
      if (i & 1) {
        input_[i] = 255;
        input16_[i] = mask_;
      } else {
        input_[i] = prng.Rand8Extremes();
        input16_[i] = prng.Rand16() & mask_;
      }
    }
  }